

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapUniq.c
# Opt level: O2

int Amap_LibFindMux(Amap_Lib_t *p,int iFan0,int iFan1,int iFan2)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 3;
  do {
    if (p->vRules3->nSize <= iVar2 + -3) {
      return -1;
    }
    iVar1 = Vec_IntEntry(p->vRules3,iVar2 + -3);
    if (iVar1 == iFan0) {
      iVar1 = Vec_IntEntry(p->vRules3,iVar2 + -2);
      if (iVar1 == iFan1) {
        iVar1 = Vec_IntEntry(p->vRules3,iVar2 + -1);
        if (iVar1 == iFan2) {
          iVar2 = Vec_IntEntry(p->vRules3,iVar2);
          return iVar2;
        }
      }
    }
    iVar2 = iVar2 + 4;
  } while( true );
}

Assistant:

int Amap_LibFindMux( Amap_Lib_t * p, int iFan0, int iFan1, int iFan2 )
{
    int x;
    for ( x = 0; x < Vec_IntSize(p->vRules3); x += 4 )
    {
        if ( Vec_IntEntry(p->vRules3, x)   == iFan0 &&
             Vec_IntEntry(p->vRules3, x+1) == iFan1 &&
             Vec_IntEntry(p->vRules3, x+2) == iFan2 )
        {
            return Vec_IntEntry(p->vRules3, x+3);
        }
    }
    return -1;
}